

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_test.c
# Opt level: O0

void test_ipc_connect_refused(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  char *pcVar4;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  char *addr;
  nng_dialer d;
  nng_socket s0;
  
  nuts_scratch_addr("ipc",0x40,test_ipc_connect_refused::nuts_addr_);
  nVar1 = nng_pair1_open((nng_socket *)((long)&addr + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                         ,0x115,"%s: expected success, got %s (%d)","nng_pair1_open(&(s0))",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(addr._4_4_,"recv-timeout",100);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                         ,0x116,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s0, NNG_OPT_RECVTIMEO, 100)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_size(addr._4_4_,"recv-size-max",200);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                         ,0x117,"%s: expected success, got %s (%d)",
                         "nng_socket_set_size(s0, NNG_OPT_RECVMAXSZ, 200)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_dialer_create((nng_dialer *)&addr,addr._4_4_,test_ipc_connect_refused::nuts_addr_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                         ,0x118,"%s: expected success, got %s (%d)",
                         "nng_dialer_create(&d, s0, addr)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  num = nng_dialer_start(addr._0_4_,0);
  pcVar3 = nng_strerror(NNG_ECONNREFUSED);
  acutest_check_((uint)(num == NNG_ECONNREFUSED),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                 ,0x119,"%s fails with %s","nng_dialer_start(d, 0)",pcVar3,nVar1);
  pcVar3 = nng_strerror(NNG_ECONNREFUSED);
  pcVar4 = nng_strerror(num);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_dialer_start(d, 0)",pcVar3,6,pcVar4,
                   (ulong)num);
  nVar1 = nng_socket_close(addr._4_4_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                         ,0x11a,"%s: expected success, got %s (%d)","nng_socket_close(s0)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

void
test_ipc_connect_refused(void)
{
	nng_socket s0;
	nng_dialer d;
	char      *addr;

	NUTS_ADDR(addr, "ipc");
	NUTS_OPEN(s0);
	NUTS_PASS(nng_socket_set_ms(s0, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_size(s0, NNG_OPT_RECVMAXSZ, 200));
	NUTS_PASS(nng_dialer_create(&d, s0, addr));
	NUTS_FAIL(nng_dialer_start(d, 0), NNG_ECONNREFUSED);
	NUTS_CLOSE(s0);
}